

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::ExpectedPrefixesCollector::ConsumeLine
          (ExpectedPrefixesCollector *this,StringPiece *line,string *out_error)

{
  size_type *psVar1;
  byte bVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  size_type sVar3;
  char *pcVar4;
  byte *pbVar5;
  mapped_type *this_01;
  undefined8 *puVar6;
  long *plVar7;
  size_type sVar8;
  ulong uVar9;
  ulong *puVar10;
  size_type sVar11;
  size_type sVar12;
  _Alloc_hider _Var13;
  undefined8 uVar14;
  byte *pbVar15;
  bool bVar16;
  StringPiece prefix;
  StringPiece package;
  string local_b8;
  string local_98;
  StringPiece local_78;
  ulong local_68 [2];
  size_type local_58;
  string local_50;
  
  local_78.length_ = (size_type)local_78.ptr_;
  sVar3 = stringpiece_internal::StringPiece::find(line,'=',0);
  local_58 = (size_type)(int)sVar3;
  if (local_58 != 0xffffffffffffffff) {
    local_78 = stringpiece_internal::StringPiece::substr(line,0,local_58);
    sVar12 = local_78.length_;
    pbVar15 = (byte *)local_78.ptr_;
    local_b8._0_16_ =
         stringpiece_internal::StringPiece::substr
                   (line,(long)((sVar3 << 0x20) + 0x100000000) >> 0x20,0xffffffffffffffff);
    sVar11 = local_b8._M_string_length;
    pcVar4 = local_b8._M_dataplus._M_p;
    sVar3 = sVar11;
    if (sVar12 != 0) {
      sVar12 = sVar12 - 1;
      sVar8 = sVar12;
      pbVar5 = pbVar15;
      do {
        if ((4 < *pbVar5 - 9) && (*pbVar5 != 0x20)) {
          pbVar15 = pbVar15 + sVar12;
          goto LAB_00272611;
        }
        local_78.length_ = sVar8;
        local_78.ptr_ = (char *)(pbVar5 + 1);
        bVar16 = sVar8 != 0;
        sVar8 = sVar8 - 1;
        pbVar5 = pbVar5 + 1;
      } while (bVar16);
    }
    goto joined_r0x00272636;
  }
  local_78.ptr_ = (char *)local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"Expected prefixes file line without equal sign: \'","");
  stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_b8,line);
  uVar9 = 0xf;
  if ((ulong *)local_78.ptr_ != local_68) {
    uVar9 = local_68[0];
  }
  if (uVar9 < local_b8._M_string_length + local_78.length_) {
    uVar14 = 0xf;
    if ((StringPiece *)local_b8._M_dataplus._M_p != (StringPiece *)&local_b8.field_2) {
      uVar14 = local_b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_b8._M_string_length + local_78.length_) goto LAB_00272799;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_78.ptr_);
  }
  else {
LAB_00272799:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_b8._M_dataplus._M_p);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  psVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_98.field_2._M_allocated_capacity = *psVar1;
    local_98.field_2._8_8_ = puVar6[3];
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar1;
    local_98._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_98._M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_50.field_2._M_allocated_capacity = *puVar10;
    local_50.field_2._8_8_ = plVar7[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *puVar10;
    local_50._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_50._M_string_length = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)out_error,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((StringPiece *)local_b8._M_dataplus._M_p != (StringPiece *)&local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  _Var13._M_p = local_78.ptr_;
  if ((ulong *)local_78.ptr_ == local_68) goto LAB_0027270f;
  goto LAB_0027270a;
  while( true ) {
    local_78.length_ = sVar8;
    pbVar15 = pbVar15 + -1;
    bVar16 = sVar8 == 0;
    sVar8 = sVar8 - 1;
    if (bVar16) break;
LAB_00272611:
    if ((4 < *pbVar15 - 9) && (*pbVar15 != 0x20)) break;
  }
joined_r0x00272636:
  do {
    if (sVar3 == 0) goto LAB_002726af;
    uVar9 = local_b8._M_string_length;
    pbVar15 = local_b8._M_dataplus._M_p;
    if ((4 < *pbVar15 - 9) && (*pbVar15 != 0x20)) {
      pbVar5 = (byte *)(pcVar4 + sVar11);
      break;
    }
    local_b8._M_string_length = uVar9 - 1;
    local_b8._M_dataplus._M_p = (pointer)(pbVar15 + 1);
    sVar3 = uVar9 - 1;
  } while( true );
  while( true ) {
    uVar9 = uVar9 - 1;
    local_b8._M_string_length = uVar9;
    if (uVar9 == 0) break;
    pbVar5 = pbVar5 + -1;
    if ((4 < *pbVar5 - 9) && (*pbVar5 != 0x20)) {
      if ((1 < uVar9) &&
         (((bVar2 = *pbVar15, bVar2 == 0x27 || (bVar2 == 0x22)) && (*pbVar5 == bVar2)))) {
        local_b8._M_string_length = uVar9 - 2;
        local_b8._M_dataplus._M_p = (pointer)(pbVar15 + 1);
      }
      break;
    }
  }
LAB_002726af:
  stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_50,(StringPiece *)&local_b8);
  this_00 = this->prefix_map_;
  stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_98,&local_78);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,&local_98);
  std::__cxx11::string::operator=((string *)this_01,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  _Var13._M_p = local_50._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0027270f;
LAB_0027270a:
  operator_delete(_Var13._M_p);
LAB_0027270f:
  return local_58 != 0xffffffffffffffff;
}

Assistant:

bool ExpectedPrefixesCollector::ConsumeLine(
    const StringPiece& line, std::string* out_error) {
  int offset = line.find('=');
  if (offset == StringPiece::npos) {
    *out_error = std::string("Expected prefixes file line without equal sign: '") +
                 std::string(line) + "'.";
    return false;
  }
  StringPiece package = line.substr(0, offset);
  StringPiece prefix = line.substr(offset + 1);
  TrimWhitespace(&package);
  TrimWhitespace(&prefix);
  MaybeUnQuote(&prefix);
  // Don't really worry about error checking the package/prefix for
  // being valid.  Assume the file is validated when it is created/edited.
  (*prefix_map_)[std::string(package)] = std::string(prefix);
  return true;
}